

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  char *pcVar6;
  size_t sVar7;
  char *__nptr;
  Gia_Man_t *pGVar8;
  Vec_Int_t *vStore;
  Vec_Int_t *vObjs;
  char *pToken;
  char *pStart;
  char *pBuffer;
  char *pChars;
  int nObjs;
  int Digit;
  int fEndOfLine;
  int Offset;
  int Type;
  Gia_Man_t *pNew;
  char *pFileName_local;
  
  __ptr = (Vec_Int_t *)Extra_FileReadContents(pFileName);
  if (__ptr == (Vec_Int_t *)0x0) {
    printf("Cannot open input file %s\n",pFileName);
  }
  pChars._4_4_ = 0;
  for (vObjs = __ptr; (char)vObjs->nCap != '\0'; vObjs = (Vec_Int_t *)((long)&vObjs->nCap + 1)) {
    pChars._4_4_ = (uint)((char)vObjs->nCap == '\n') + pChars._4_4_;
  }
  p = Vec_IntAlloc(pChars._4_4_);
  p_00 = Vec_IntAlloc(pChars._4_4_ * 10);
  pToken = (char *)__ptr;
  while( true ) {
    pcVar6 = strtok(pToken," w(-,)]\r\t");
    pToken = (char *)0x0;
    if (pcVar6 == (char *)0x0) {
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      pGVar8 = Gia_ManBuildGig(p,p_00,pFileName);
      Vec_IntFree(p);
      Vec_IntFree(p_00);
      return pGVar8;
    }
    iVar2 = Vec_IntSize(p_00);
    Vec_IntPush(p,iVar2);
    if ((*pcVar6 < '0') || ('9' < *pcVar6)) {
      __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xe6,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    iVar2 = atoi(pcVar6);
    Vec_IntPush(p_00,iVar2);
    pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
    if (*pcVar6 != '=') {
      __assert_fail("pToken[0] == \'=\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xea,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
    sVar7 = strlen(pcVar6);
    cVar1 = pcVar6[sVar7 - 1];
    if (cVar1 == '\n') {
      sVar7 = strlen(pcVar6);
      pcVar6[sVar7 - 1] = '\0';
    }
    fEndOfLine = 1;
    while ((fEndOfLine < 10 && (iVar2 = strcmp(pcVar6,s_GigNames[fEndOfLine]), iVar2 != 0))) {
      fEndOfLine = fEndOfLine + 1;
    }
    if (9 < fEndOfLine) break;
    Vec_IntPush(p_00,fEndOfLine);
    if (cVar1 != '\n') {
      iVar2 = Vec_IntSize(p_00);
      Vec_IntPush(p_00,0);
      while (((pcVar6 = strtok((char *)0x0," w(-,)]\r\t"), pcVar6 != (char *)0x0 &&
              (*pcVar6 != '\n')) && (*pcVar6 != '['))) {
        if ((*pcVar6 < '0') || ('9' < *pcVar6)) {
          __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x102,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        iVar4 = atoi(pcVar6);
        Vec_IntPush(p_00,iVar4);
        Vec_IntAddToEntry(p_00,iVar2,1);
      }
      if (pcVar6 == (char *)0x0) {
        __assert_fail("pToken != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x106,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      if (*pcVar6 != '\n') {
        if (*pcVar6 != '[') {
          __assert_fail("pToken[0] == \'[\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x109,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        __nptr = pcVar6 + 1;
        if (fEndOfLine == 5) {
          sVar7 = strlen(__nptr);
          if (sVar7 != 4) {
            __assert_fail("strlen(pToken) == 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                          ,0x10e,"Gia_Man_t *Gia_ManReadGig(char *)");
          }
          uVar3 = Abc_TtReadHexDigit(*__nptr);
          iVar2 = Abc_TtReadHexDigit(pcVar6[2]);
          iVar4 = Abc_TtReadHexDigit(pcVar6[3]);
          iVar5 = Abc_TtReadHexDigit(pcVar6[4]);
          Vec_IntPush(p_00,iVar5 << 0xc | iVar4 << 8 | iVar2 << 4 | uVar3);
        }
        else {
          if (fEndOfLine != 6) {
            __assert_fail("Type == GIG_DELAY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                          ,0x117,"Gia_Man_t *Gia_ManReadGig(char *)");
          }
          iVar2 = atoi(__nptr);
          Vec_IntPush(p_00,iVar2);
        }
        pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
        if (*pcVar6 != '\n') {
          __assert_fail("pToken[0] == \'\\n\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x11c,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
      }
    }
  }
  __assert_fail("Type < GIG_UNUSED",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                ,0xf6,"Gia_Man_t *Gia_ManReadGig(char *)");
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    Gia_Man_t * pNew;
    int Type, Offset, fEndOfLine, Digit, nObjs; 
    char * pChars  = " w(-,)]\r\t";
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pStart  = pBuffer, * pToken;
    Vec_Int_t * vObjs, * vStore;
    if ( pBuffer == NULL )
        printf( "Cannot open input file %s\n", pFileName );
    // count objects
    for ( nObjs = 0, pToken = pBuffer; *pToken; pToken++ )
        nObjs += (int)(*pToken == '\n');
    // read objects
    vObjs  = Vec_IntAlloc( nObjs );
    vStore = Vec_IntAlloc( 10*nObjs );
    while ( 1 )
    {
        // read net ID
        pToken = strtok( pStart, pChars );
        pStart = NULL;
        if ( pToken == NULL )
            break;
        // start new object
        Vec_IntPush( vObjs, Vec_IntSize(vStore) );
        // save net ID
        assert( pToken[0] >= '0' && pToken[0] <= '9' );
        Vec_IntPush( vStore, atoi(pToken) );
        // read equal
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '=' );
        // read type
        pToken = strtok( pStart, pChars );
        fEndOfLine = 0;
        if ( pToken[strlen(pToken)-1] == '\n' )
        {
            pToken[strlen(pToken)-1] = 0;
            fEndOfLine = 1;
        }
        for ( Type = GIG_RESET; Type < GIG_UNUSED; Type++ )
            if ( !strcmp(pToken, s_GigNames[Type]) )
                break;
        assert( Type < GIG_UNUSED );
        Vec_IntPush( vStore, Type );
        if ( fEndOfLine )
            continue;
        // read fanins
        Offset = Vec_IntSize(vStore);
        Vec_IntPush( vStore, 0 );
        while ( 1 )
        {
            pToken = strtok( pStart, pChars );
            if ( pToken == NULL || pToken[0] == '\n' || pToken[0] == '[' )
                break;
            assert( pToken[0] >= '0' && pToken[0] <= '9' );
            Vec_IntPush( vStore, atoi(pToken) );
            Vec_IntAddToEntry( vStore, Offset, 1 );
        }
        assert( pToken != NULL );
        if ( pToken[0] == '\n' )
            continue;
        assert( pToken[0] == '[' );
        // read attribute
        pToken++;
        if ( Type == GIG_LUT )
        {
            assert( strlen(pToken) == 4 );
            Digit  = Abc_TtReadHexDigit(pToken[0]);
            Digit |= Abc_TtReadHexDigit(pToken[1]) << 4;
            Digit |= Abc_TtReadHexDigit(pToken[2]) << 8;
            Digit |= Abc_TtReadHexDigit(pToken[3]) << 12;
            Vec_IntPush( vStore, Digit );
        }
        else
        {
            assert( Type == GIG_DELAY );
            Vec_IntPush( vStore, atoi(pToken) );
        }
        // read end of line
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '\n' );
    }
    ABC_FREE( pBuffer );
    // create AIG
    pNew = Gia_ManBuildGig( vObjs, vStore, pFileName );
    // cleanup
    Vec_IntFree( vObjs );
    Vec_IntFree( vStore );
    return pNew;
}